

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_IndexedTriangleStripSet(X3DImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FIReader *pFVar3;
  char *pcVar4;
  CX3DImporter_NodeElement *pCVar5;
  _func_int **pp_Var6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var12;
  runtime_error *this_00;
  int *__args;
  iterator iVar13;
  string *psVar14;
  pointer piVar15;
  ulong uVar16;
  char *__end;
  string an;
  CX3DImporter_NodeElement *ne;
  int32_t idx [3];
  vector<int,_std::allocator<int>_> index;
  string def;
  string use;
  bool local_cc;
  bool local_cb;
  bool local_ca;
  bool local_c9;
  string local_c0;
  CX3DImporter_NodeElement *local_a0;
  int local_94 [3];
  vector<int,_std::allocator<int>_> local_88;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_a0 = (CX3DImporter_NodeElement *)0x0;
  uVar9 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar9 < 1) {
    local_ca = true;
    local_cb = true;
    local_c9 = true;
    local_cc = true;
  }
  else {
    uVar16 = 0;
    local_cc = true;
    local_c9 = true;
    local_cb = true;
    local_ca = true;
    do {
      pFVar3 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar11 = (int)uVar16;
      iVar10 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                         (pFVar3,uVar16);
      std::__cxx11::string::string
                ((string *)&local_c0,(char *)CONCAT44(extraout_var,iVar10),(allocator *)local_94);
      iVar10 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar10 == 0) {
        iVar10 = (*(((this->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                   super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar10);
        psVar14 = &local_70;
LAB_006ad3b4:
        pcVar4 = (char *)psVar14->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar4,(ulong)__s);
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar10 == 0) {
          iVar10 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar10);
          psVar14 = &local_50;
          goto LAB_006ad3b4;
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_c0);
        if (((iVar10 != 0) &&
            (iVar10 = std::__cxx11::string::compare((char *)&local_c0), iVar10 != 0)) &&
           (iVar10 = std::__cxx11::string::compare((char *)&local_c0), iVar10 != 0)) {
          iVar10 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar10 == 0) {
            local_cc = XML_ReadNode_GetAttrVal_AsBool(this,iVar11);
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar10 == 0) {
              local_c9 = XML_ReadNode_GetAttrVal_AsBool(this,iVar11);
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)&local_c0);
              if (iVar10 == 0) {
                XML_ReadNode_GetAttrVal_AsArrI32(this,iVar11,&local_88);
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)&local_c0);
                if (iVar10 == 0) {
                  local_ca = XML_ReadNode_GetAttrVal_AsBool(this,iVar11);
                }
                else {
                  iVar10 = std::__cxx11::string::compare((char *)&local_c0);
                  if (iVar10 == 0) {
                    local_cb = XML_ReadNode_GetAttrVal_AsBool(this,iVar11);
                  }
                  else {
                    Throw_IncorrectAttr(this,&local_c0);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      uVar16 = (ulong)(iVar11 + 1U);
    } while (uVar9 != iVar11 + 1U);
  }
  if (local_50._M_string_length == 0) {
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,
                 "IndexedTriangleStripSet must contain not empty \"index\" attribute.","");
      std::runtime_error::runtime_error(this_00,(string *)&local_c0);
      *(undefined ***)this_00 = &PTR__runtime_error_0081d260;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_a0 = (CX3DImporter_NodeElement *)operator_new(0xf0);
    pCVar5 = this->NodeElement_Cur;
    local_a0->Type = ENET_IndexedTriangleStripSet;
    (local_a0->ID)._M_dataplus._M_p = (pointer)&(local_a0->ID).field_2;
    (local_a0->ID)._M_string_length = 0;
    (local_a0->ID).field_2._M_local_buf[0] = '\0';
    local_a0->Parent = pCVar5;
    (local_a0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a0->Child;
    (local_a0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a0->Child;
    (local_a0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_a0[1]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_a0[1].Type = 0;
    *(CX3DImporter_NodeElement **)&local_a0[1].Type = local_a0 + 1;
    local_a0[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_a0 + 1);
    local_a0[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_a0[1].ID._M_string_length = 0;
    local_a0[1].ID.field_2._M_local_buf[0] = '\x01';
    local_a0->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_IndexedSet_008f08e0;
    *(undefined8 *)((long)&local_a0[1].ID.field_2 + 8) = 0;
    local_a0[1].Parent = (CX3DImporter_NodeElement *)0x0;
    local_a0[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_a0[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_a0[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_a0[2].Type = 0;
    *(undefined8 *)((long)&local_a0[2].ID.field_2 + 8) = 0;
    local_a0[2].ID._M_string_length = 0;
    local_a0[2].ID.field_2._M_allocated_capacity = 0;
    local_a0[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_a0[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_a0[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_a0->ID);
    }
    pCVar5 = local_a0;
    local_a0[1].ID.field_2._M_local_buf[1] = local_cc;
    *(bool *)&local_a0[1].Child.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node.super__List_node_base._M_prev = local_c9;
    *(bool *)&local_a0[2].Parent = local_ca;
    local_a0[1].ID.field_2._M_local_buf[0] = local_cb;
    pp_Var6 = (_func_int **)
              local_a0[1].Child.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    if (local_a0[2]._vptr_CX3DImporter_NodeElement != pp_Var6) {
      local_a0[2]._vptr_CX3DImporter_NodeElement = pp_Var6;
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      psVar1 = &local_a0[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      uVar9 = 0;
      piVar15 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        local_94[2] = *piVar15;
        uVar7 = 0;
        if (-1 < *piVar15) {
          if (1 < (int)uVar9) {
            iVar13._M_current = (int *)pCVar5[2]._vptr_CX3DImporter_NodeElement;
            if (local_cc == false) {
              if (iVar13._M_current == *(int **)&pCVar5[2].Type) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)psVar1,iVar13,local_94);
              }
              else {
                *iVar13._M_current = local_94[0];
                pCVar5[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar5[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              iVar13._M_current = (int *)pCVar5[2]._vptr_CX3DImporter_NodeElement;
              if (iVar13._M_current == *(int **)&pCVar5[2].Type) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)psVar1,iVar13,local_94 + 2);
              }
              else {
                *iVar13._M_current = local_94[2];
                pCVar5[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar5[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              iVar13._M_current = (int *)pCVar5[2]._vptr_CX3DImporter_NodeElement;
              __args = local_94 + 1;
            }
            else {
              if (iVar13._M_current == *(int **)&pCVar5[2].Type) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)psVar1,iVar13,local_94);
              }
              else {
                *iVar13._M_current = local_94[0];
                pCVar5[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar5[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              iVar13._M_current = (int *)pCVar5[2]._vptr_CX3DImporter_NodeElement;
              if (iVar13._M_current == *(int **)&pCVar5[2].Type) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)psVar1,iVar13,local_94 + 1);
              }
              else {
                *iVar13._M_current = local_94[1];
                pCVar5[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar5[2]._vptr_CX3DImporter_NodeElement + 4);
              }
              iVar13._M_current = (int *)pCVar5[2]._vptr_CX3DImporter_NodeElement;
              __args = local_94 + 2;
            }
            if (iVar13._M_current == *(int **)&pCVar5[2].Type) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)psVar1,iVar13,__args);
            }
            else {
              *iVar13._M_current = *__args;
              pCVar5[2]._vptr_CX3DImporter_NodeElement =
                   (_func_int **)((long)pCVar5[2]._vptr_CX3DImporter_NodeElement + 4);
            }
            local_c0._M_dataplus._M_p._0_4_ = 0xffffffff;
            iVar13._M_current = (int *)pCVar5[2]._vptr_CX3DImporter_NodeElement;
            if (iVar13._M_current == *(int **)&pCVar5[2].Type) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)psVar1,iVar13,(int *)&local_c0);
            }
            else {
              *iVar13._M_current = -1;
              pCVar5[2]._vptr_CX3DImporter_NodeElement =
                   (_func_int **)((long)pCVar5[2]._vptr_CX3DImporter_NodeElement + 4);
            }
          }
          local_94[uVar9 & 1] = local_94[2];
          uVar7 = uVar9 + 1;
        }
        uVar9 = uVar7;
        piVar15 = piVar15 + 1;
      } while (piVar15 !=
               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    iVar10 = (*(((this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
               super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar10 == '\0') {
      ParseHelper_Node_Enter(this,local_a0);
      paVar2 = &local_c0.field_2;
      do {
        do {
          while( true ) {
            iVar10 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar10 == '\0') goto LAB_006adab0;
            iVar11 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar11 != 1) break;
            local_c0._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Color","");
            (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar10 = std::__cxx11::string::compare((char *)&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            if (iVar10 == 0) {
              ParseNode_Rendering_Color(this);
            }
            else {
              local_c0._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ColorRGBA","");
              (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar10 = std::__cxx11::string::compare((char *)&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != paVar2) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
              if (iVar10 == 0) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                local_c0._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Coordinate","")
                ;
                (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar10 = std::__cxx11::string::compare((char *)&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != paVar2) {
                  operator_delete(local_c0._M_dataplus._M_p);
                }
                if (iVar10 == 0) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  local_c0._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Normal","");
                  (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar10 = std::__cxx11::string::compare((char *)&local_c0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != paVar2) {
                    operator_delete(local_c0._M_dataplus._M_p);
                  }
                  if (iVar10 == 0) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    local_c0._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_c0,"TextureCoordinate","");
                    (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                    iVar10 = std::__cxx11::string::compare((char *)&local_c0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c0._M_dataplus._M_p != paVar2) {
                      operator_delete(local_c0._M_dataplus._M_p);
                    }
                    if (iVar10 == 0) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar8 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar8) {
                        local_c0._M_dataplus._M_p = (pointer)paVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_c0,"IndexedTriangleStripSet","");
                        XML_CheckNode_SkipUnsupported(this,&local_c0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c0._M_dataplus._M_p != paVar2) {
                          operator_delete(local_c0._M_dataplus._M_p);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar11 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar11 != 2);
        local_c0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"IndexedTriangleStripSet","");
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar11 = std::__cxx11::string::compare((char *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      } while (iVar11 != 0);
      if ((char)iVar10 == '\0') {
LAB_006adab0:
        local_c0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"IndexedTriangleStripSet","");
        Throw_CloseNotFound(this,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      pCVar5 = this->NodeElement_Cur;
      p_Var12 = (_List_node_base *)operator_new(0x18);
      p_Var12[1]._M_next = (_List_node_base *)local_a0;
      std::__detail::_List_node_base::_M_hook(p_Var12);
      psVar1 = &(pCVar5->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var12 = (_List_node_base *)operator_new(0x18);
    p_Var12[1]._M_next = (_List_node_base *)local_a0;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    psVar1 = &(this->NodeElement_List).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar8 = FindNodeElement(this,&local_50,ENET_IndexedTriangleStripSet,&local_a0);
    if (!bVar8) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar5 = this->NodeElement_Cur;
    p_Var12 = (_List_node_base *)operator_new(0x18);
    p_Var12[1]._M_next = (_List_node_base *)local_a0;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    psVar1 = &(pCVar5->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_IndexedTriangleStripSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> index;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("index", index, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_IndexedTriangleStripSet, ne);
	}
	else
	{
		// check data
		if(index.size() == 0) throw DeadlyImportError("IndexedTriangleStripSet must contain not empty \"index\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_IndexedSet& ne_alias = *((CX3DImporter_NodeElement_IndexedSet*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;

		ne_alias.CoordIndex.clear();
		int counter = 0;
		int32_t idx[3];
		for(std::vector<int32_t>::const_iterator idx_it = index.begin(); idx_it != index.end(); ++idx_it)
		{
			idx[2] = *idx_it;
			if (idx[2] < 0)
			{
				counter = 0;
			}
			else
			{
				if (counter >= 2)
				{
					if(ccw)
					{
						ne_alias.CoordIndex.push_back(idx[0]);
						ne_alias.CoordIndex.push_back(idx[1]);
						ne_alias.CoordIndex.push_back(idx[2]);
					}
					else
					{
						ne_alias.CoordIndex.push_back(idx[0]);
						ne_alias.CoordIndex.push_back(idx[2]);
						ne_alias.CoordIndex.push_back(idx[1]);
					}
					ne_alias.CoordIndex.push_back(-1);
				}
				idx[counter & 1] = idx[2];
				++counter;
			}
		}// for(std::list<int32_t>::const_iterator idx_it = index.begin(); idx_it != ne_alias.index.end(); idx_it++)

        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("IndexedTriangleStripSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("IndexedTriangleStripSet");

			MACRO_NODECHECK_LOOPEND("IndexedTriangleStripSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}